

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Normal3f *n;
  Vector3<float> *v;
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ShapeSample *pSVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  Point3<float> *p2;
  long lVar24;
  undefined1 auVar25 [16];
  Float FVar26;
  type tVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar54;
  float fVar55;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar51;
  undefined1 auVar52 [56];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var_03 [60];
  undefined1 auVar47 [64];
  undefined1 auVar53 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float s;
  float s_00;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  Point3f PVar64;
  Point3f PVar65;
  array<float,_3> aVar66;
  Vector3<float> VVar67;
  Normal3<float> NVar68;
  Normal3<float> NVar69;
  Normal3<float> NVar70;
  initializer_list<float> v_00;
  initializer_list<pbrt::Point3<float>_> v_01;
  span<const_float> w_00;
  span<const_float> w_01;
  Tuple2<pbrt::Point2,_float> local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Tuple3<pbrt::Vector3,_float> local_178;
  undefined4 local_16c;
  undefined1 local_168 [12];
  float fStack_15c;
  Tuple3<pbrt::Vector3,_float> local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  array<float,_4> w;
  float fStack_100;
  float fStack_fc;
  Float triPDF;
  optional<pbrt::ShapeSample> ss;
  Tuple3<pbrt::Point3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  lVar5 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar21 = (long)this->triIndex;
  lVar6 = *(long *)(lVar5 + 8);
  lVar7 = *(long *)(lVar5 + 0x10);
  lVar22 = (long)*(int *)(lVar6 + lVar21 * 0xc) * 0xc;
  lVar23 = (long)*(int *)(lVar6 + 4 + lVar21 * 0xc) * 0xc;
  lVar24 = (long)*(int *)(lVar6 + 8 + lVar21 * 0xc) * 0xc;
  fVar28 = *(float *)(lVar7 + 8 + lVar22);
  fVar55 = *(float *)(lVar7 + 8 + lVar23);
  uVar2 = *(undefined8 *)(lVar7 + lVar22);
  local_148 = (float)uVar2;
  fStack_144 = (float)((ulong)uVar2 >> 0x20);
  fStack_140 = 0.0;
  fStack_13c = 0.0;
  uVar3 = *(ulong *)(lVar7 + lVar23);
  uVar4 = *(ulong *)(lVar7 + lVar24);
  fVar1 = *(float *)(lVar7 + 8 + lVar24);
  auVar52 = (undefined1  [56])0x0;
  PVar64 = ShapeSampleContext::p(ctx);
  ss.optionalValue._8_4_ = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
  auVar32._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar32._8_56_ = auVar52;
  ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar32._0_16_);
  FVar26 = SolidAngle(this,(Point3f *)&ss);
  if ((FVar26 < 0.0002) || (6.22 < FVar26)) {
    Sample(&ss,this,u);
    FVar26 = ctx->time;
    pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
    auVar52 = (undefined1  [56])0x0;
    (pSVar20->intr).time = FVar26;
    pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
    PVar64 = Interaction::p(&pSVar20->intr);
    auVar34._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar34._8_56_ = auVar52;
    PVar65 = ShapeSampleContext::p(ctx);
    auVar35._0_8_ = PVar65.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar35._8_56_ = auVar52;
    auVar25 = vsubps_avx(auVar34._0_16_,auVar35._0_16_);
    w.values[2] = PVar64.super_Tuple3<pbrt::Point3,_float>.z -
                  PVar65.super_Tuple3<pbrt::Point3,_float>.z;
    w.values._0_8_ = vmovlps_avx(auVar25);
    auVar29._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar29._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar29._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar29._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar25 = vhaddps_avx(auVar29,auVar29);
    fVar28 = w.values[2] * w.values[2] + auVar25._0_4_;
    auVar52 = (undefined1  [56])0x0;
    if ((fVar28 != 0.0) || (NAN(fVar28))) {
      VVar67 = Normalize<float>((Vector3<float> *)&w);
      w.values[2] = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar36._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar36._8_56_ = auVar52;
      w.values._0_8_ = vmovlps_avx(auVar36._0_16_);
      pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      auVar25._0_8_ = w.values._0_8_ ^ 0x8000000080000000;
      auVar25._8_4_ = 0x80000000;
      auVar25._12_4_ = 0x80000000;
      local_178.z = -w.values[2];
      local_178._0_8_ = vmovlps_avx(auVar25);
      tVar27 = AbsDot<float>(&(pSVar20->intr).n,(Vector3<float> *)&local_178);
      auVar52 = extraout_var_04;
      PVar64 = ShapeSampleContext::p(ctx);
      local_158.z = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
      auVar37._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar37._8_56_ = auVar52;
      local_158._0_8_ = vmovlps_avx(auVar37._0_16_);
      pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      PVar64 = Interaction::p(&pSVar20->intr);
      local_50.z = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
      auVar38._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar38._8_56_ = auVar52;
      local_50._0_8_ = vmovlps_avx(auVar38._0_16_);
      fVar28 = DistanceSquared<float>((pbrt *)&local_158,(Point3<float> *)&local_50,p2);
      pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      pSVar20->pdf = pSVar20->pdf / (tVar27 / fVar28);
      pSVar20 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      if (ABS(pSVar20->pdf) != INFINITY) {
        pstd::optional<pbrt::ShapeSample>::optional(__return_storage_ptr__,&ss);
        goto LAB_0031b151;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_0031b151:
    pstd::optional<pbrt::ShapeSample>::~optional(&ss);
    return __return_storage_ptr__;
  }
  auVar52 = ZEXT456(0);
  if ((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
      (fVar56 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar56 == 0.0)) && (!NAN(fVar56))) {
    fVar56 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    auVar52 = (undefined1  [56])0x0;
    if ((fVar56 == 0.0) && (!NAN(fVar56))) {
      auVar33 = ZEXT464(0x3f800000);
      local_198 = u.super_Tuple2<pbrt::Point2,_float>;
      goto LAB_0031b302;
    }
  }
  n = &ctx->ns;
  PVar64 = ShapeSampleContext::p(ctx);
  fVar56 = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
  auVar39._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar39._8_56_ = auVar52;
  _local_168 = auVar39._0_16_;
  auVar9._4_4_ = fStack_144;
  auVar9._0_4_ = local_148;
  auVar9._8_4_ = fStack_140;
  auVar9._12_4_ = fStack_13c;
  auVar25 = vsubps_avx(auVar9,_local_168);
  auVar52 = ZEXT856(auVar25._8_8_);
  w.values[2] = fVar28 - fVar56;
  w.values._0_8_ = vmovlps_avx(auVar25);
  VVar67 = Normalize<float>((Vector3<float> *)&w);
  ss.optionalValue._8_4_ = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar40._8_56_ = auVar52;
  v = (Vector3<float> *)((long)&ss.optionalValue + 0xc);
  ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar40._0_16_);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar25 = vsubps_avx(auVar8,_local_168);
  auVar52 = ZEXT856(auVar25._8_8_);
  local_178.z = fVar55 - fVar56;
  local_178._0_8_ = vmovlps_avx(auVar25);
  VVar67 = Normalize<float>((Vector3<float> *)&local_178);
  ss.optionalValue._20_4_ = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar41._8_56_ = auVar52;
  ss.optionalValue._12_8_ = vmovlps_avx(auVar41._0_16_);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar4;
  auVar25 = vsubps_avx(auVar17,_local_168);
  auVar52 = ZEXT856(auVar25._8_8_);
  local_158.z = fVar1 - fVar56;
  local_158._0_8_ = vmovlps_avx(auVar25);
  VVar67 = Normalize<float>((Vector3<float> *)&local_158);
  ss.optionalValue._32_4_ = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar42._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar42._8_56_ = auVar52;
  ss.optionalValue._24_8_ = vmovlps_avx(auVar42._0_16_);
  auVar43._0_4_ = AbsDot<float>(n,v);
  auVar43._4_60_ = extraout_var;
  auVar25 = vmaxss_avx(auVar43._0_16_,ZEXT416(0x3c23d70a));
  local_178.x = auVar25._0_4_;
  auVar44._0_4_ = AbsDot<float>(n,v);
  auVar44._4_60_ = extraout_var_00;
  auVar25 = vmaxss_avx(auVar44._0_16_,ZEXT416(0x3c23d70a));
  local_178.y = auVar25._0_4_;
  auVar45._0_4_ = AbsDot<float>(n,(Vector3<float> *)&ss);
  auVar45._4_60_ = extraout_var_01;
  auVar25 = vmaxss_avx(auVar45._0_16_,ZEXT416(0x3c23d70a));
  local_178.z = auVar25._0_4_;
  auVar46._0_4_ = AbsDot<float>(n,(Vector3<float> *)((long)&ss.optionalValue + 0x18));
  auVar46._4_60_ = extraout_var_02;
  auVar25 = vmaxss_avx(auVar46._0_16_,ZEXT416(0x3c23d70a));
  local_16c = auVar25._0_4_;
  v_00._M_len = 4;
  v_00._M_array = &local_178.x;
  pstd::array<float,_4>::array(&w,v_00);
  w_00.n = 4;
  w_00.ptr = w.values;
  local_198 = (Tuple2<pbrt::Point2,_float>)SampleBilinear(u,w_00);
  w_01.n = 4;
  w_01.ptr = w.values;
  auVar33._0_4_ = BilinearPDF((Point2f)local_198,w_01);
  auVar33._4_60_ = extraout_var_03;
LAB_0031b302:
  auVar52 = auVar33._8_56_;
  auVar13._4_4_ = fStack_144;
  auVar13._0_4_ = local_148;
  auVar13._8_4_ = fStack_140;
  auVar13._12_4_ = fStack_13c;
  local_168._0_4_ = auVar33._0_4_;
  w.values._0_8_ = vmovlps_avx(auVar13);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar3;
  unique0x00006b80 = vmovlps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar4;
  vmovlps_avx(auVar18);
  v_01._M_len = 3;
  v_01._M_array = (iterator)&w;
  w.values[2] = fVar28;
  pstd::array<pbrt::Point3<float>,_3>::array((array<pbrt::Point3<float>,_3> *)&ss,v_01);
  PVar64 = ShapeSampleContext::p(ctx);
  aVar66 = SampleSphericalTriangle
                     ((array<pbrt::Point3<float>,_3> *)&ss,PVar64,(Point2f)local_198,&triPDF);
  fVar56 = aVar66.values[2];
  auVar47._0_8_ = aVar66.values._0_8_;
  auVar47._8_56_ = auVar52;
  if ((triPDF != 0.0) || (NAN(triPDF))) {
    fVar10 = triPDF * (float)local_168._0_4_;
    auVar58._8_4_ = 0x7fffffff;
    auVar58._0_8_ = 0x7fffffff7fffffff;
    auVar58._12_4_ = 0x7fffffff;
    auVar9 = vmovshdup_avx(auVar47._0_16_);
    auVar14._4_4_ = fStack_144;
    auVar14._0_4_ = local_148;
    auVar14._8_4_ = fStack_140;
    auVar14._12_4_ = fStack_13c;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar3;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar4;
    s_00 = auVar9._0_4_;
    s = aVar66.values[0];
    auVar25 = vandps_avx(ZEXT416((uint)(fVar55 * s_00)),auVar58);
    auVar29 = vandps_avx(ZEXT416((uint)(fVar28 * s)),auVar58);
    fVar63 = (float)(uVar4 >> 0x20);
    w.values[2] = fVar1 * fVar56 + fVar28 * s + fVar55 * s_00;
    fVar11 = (1.0 - s) - s_00;
    auVar61._0_4_ = (float)uVar3 * s_00;
    auVar61._4_4_ = (float)(uVar3 >> 0x20) * auVar9._4_4_;
    fVar51 = auVar9._8_4_;
    auVar61._8_4_ = fVar51 * 0.0;
    fVar54 = auVar9._12_4_;
    auVar61._12_4_ = fVar54 * 0.0;
    auVar9 = vandps_avx(auVar61,auVar58);
    _local_168 = ZEXT416((uint)fVar11);
    auVar8 = vandps_avx(ZEXT416((uint)(fVar1 * fVar11)),auVar58);
    ss.optionalValue._8_4_ = (auVar29._0_4_ + auVar25._0_4_ + auVar8._0_4_) * 3.57628e-07;
    auVar60._0_4_ = local_148 * s;
    auVar60._4_4_ = fStack_144 * s;
    auVar60._8_4_ = fStack_140 * s;
    auVar60._12_4_ = fStack_13c * s;
    auVar25 = vandps_avx(auVar60,auVar58);
    auVar62._0_4_ = (float)uVar4 * fVar11;
    auVar62._4_4_ = fVar63 * fVar11;
    auVar62._8_4_ = fVar11 * 0.0;
    auVar62._12_4_ = fVar11 * 0.0;
    auVar29 = vandps_avx(auVar62,auVar58);
    auVar59._0_4_ = auVar9._0_4_ + auVar25._0_4_ + auVar29._0_4_;
    auVar59._4_4_ = auVar9._4_4_ + auVar25._4_4_ + auVar29._4_4_;
    auVar59._8_4_ = auVar9._8_4_ + auVar25._8_4_ + auVar29._8_4_;
    auVar59._12_4_ = auVar9._12_4_ + auVar25._12_4_ + auVar29._12_4_;
    auVar12._8_4_ = 0x34c00005;
    auVar12._0_8_ = 0x34c0000534c00005;
    auVar12._12_4_ = 0x34c00005;
    auVar25 = vmulps_avx512vl(auVar59,auVar12);
    ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar25);
    auVar57._0_4_ = (float)uVar4 * fVar56 + auVar60._0_4_ + auVar61._0_4_;
    auVar57._4_4_ = fVar63 * fVar56 + auVar60._4_4_ + auVar61._4_4_;
    auVar57._8_4_ = fVar56 * 0.0 + auVar60._8_4_ + auVar61._8_4_;
    auVar57._12_4_ = fVar56 * 0.0 + auVar60._12_4_ + auVar61._12_4_;
    w.values._0_8_ = vmovlps_avx(auVar57);
    auVar25 = vsubps_avx(auVar16,auVar14);
    local_50.z = fVar55 - fVar28;
    local_50._0_8_ = vmovlps_avx(auVar25);
    auVar25 = vsubps_avx(auVar19,auVar14);
    auVar53 = ZEXT856(auVar25._8_8_);
    local_40.z = fVar1 - fVar28;
    local_40._0_8_ = vmovlps_avx(auVar25);
    VVar67 = Cross<float>((Vector3<float> *)&local_50,(Vector3<float> *)&local_40);
    local_158.z = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar48._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar48._8_56_ = auVar53;
    local_158._0_8_ = vmovlps_avx(auVar48._0_16_);
    NVar68 = Normalize<float>((Normal3<float> *)&local_158);
    local_178.z = NVar68.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar49._0_8_ = NVar68.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar49._8_56_ = auVar53;
    local_178._0_8_ = vmovlps_avx(auVar49._0_16_);
    if (*(long *)(lVar5 + 0x18) == 0) {
      if (*(char *)(lVar5 + 0x38) != *(char *)(lVar5 + 0x39)) {
        auVar31._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar53._0_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar53._4_4_ ^ 0x80000000;
        local_178._0_8_ = vmovlps_avx(auVar31);
        local_178.z = -local_178.z;
      }
    }
    else {
      fStack_100 = auVar52._0_4_;
      fStack_fc = auVar52._4_4_;
      NVar68 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          (*(long *)(lVar5 + 0x18) + (long)*(int *)(lVar6 + lVar21 * 0xc) * 0xc),s);
      local_178.y = fStack_fc;
      local_178.x = fStack_100;
      NVar69 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          ((long)*(int *)(lVar6 + 4 + lVar21 * 0xc) * 0xc + *(long *)(lVar5 + 0x18))
                          ,s_00);
      local_148 = NVar69.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_144 = NVar69.super_Tuple3<pbrt::Normal3,_float>.y;
      fVar28 = (float)local_168._8_4_;
      fVar55 = fStack_15c;
      fStack_138 = fVar51;
      fStack_134 = fVar54;
      NVar70 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          ((long)*(int *)(lVar6 + 8 + lVar21 * 0xc) * 0xc + *(long *)(lVar5 + 0x18))
                          ,(float)local_168._0_4_);
      local_158.z = NVar70.super_Tuple3<pbrt::Normal3,_float>.z +
                    NVar69.super_Tuple3<pbrt::Normal3,_float>.z +
                    NVar68.super_Tuple3<pbrt::Normal3,_float>.z;
      local_188 = NVar68.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_184 = NVar68.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar30._0_4_ = local_148 + local_188 + NVar70.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar30._4_4_ = fStack_144 + fStack_184 + NVar70.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar30._8_4_ = fStack_140 + fStack_180 + fVar28;
      auVar30._12_4_ = fStack_13c + fStack_17c + fVar55;
      auVar52 = ZEXT856(auVar30._8_8_);
      local_158._0_8_ = vmovlps_avx(auVar30);
      NVar68 = FaceForward<float>((Normal3<float> *)&local_178,(Normal3<float> *)&local_158);
      local_178.z = NVar68.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar50._0_8_ = NVar68.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar50._8_56_ = auVar52;
      local_178._0_8_ = vmovlps_avx(auVar50._0_16_);
    }
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&w,(Vector3f *)&ss);
    FVar26 = ctx->time;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar26;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_178._0_8_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_178.z;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = ZEXT816(0) << 0x20
    ;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar10;
  }
  else {
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x20) =
         ZEXT1264(ZEXT812(0));
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = ZEXT1264(ZEXT812(0));
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf = BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;
        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }